

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

int av1_compound_single_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MV *this_mv,uint8_t *second_pred,
              uint8_t *mask,int mask_stride,int *rate_mv,int ref_idx)

{
  MV MVar1;
  int iVar2;
  MV *in_RCX;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  long in_RSI;
  long in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  int in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000018;
  MV start_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  uint sse;
  int dis;
  int use_fractional_mv;
  int i_1;
  FULLPEL_MV start_fullmv;
  search_site_config *src_search_sites;
  SEARCH_METHODS search_method;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int_mv best_mv;
  int bestsme;
  int mi_col;
  int mi_row;
  int i;
  buf_2d orig_yv12;
  YV12_BUFFER_CONFIG *scaled_ref_frame;
  buf_2d backup_yv12 [3];
  MvCosts *mv_costs;
  macroblockd_plane *pd;
  int_mv ref_mv;
  int ref;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  SEARCH_METHODS search_method_00;
  int **mvcost;
  MACROBLOCK *in_stack_fffffffffffffd10;
  undefined4 uVar6;
  int_mv *mv;
  AV1_COMP *in_stack_fffffffffffffd18;
  uint uVar7;
  MV *ref_mv_00;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  MACROBLOCK *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd41;
  BLOCK_SIZE in_stack_fffffffffffffd4f;
  MACROBLOCK *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd6c;
  MACROBLOCKD *in_stack_fffffffffffffd70;
  MV *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  BLOCK_SIZE in_stack_fffffffffffffd97;
  MACROBLOCK *in_stack_fffffffffffffd98;
  AV1_COMP *in_stack_fffffffffffffda0;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffda8;
  FULLPEL_MV in_stack_fffffffffffffdb4;
  search_site_config *in_stack_fffffffffffffdc0;
  SEARCH_METHODS in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  int_mv local_224;
  undefined8 local_220;
  int local_218;
  FULLPEL_MV local_214;
  search_site_config *local_210;
  byte local_205;
  undefined1 local_204 [28];
  MSBuffers MStack_1e8;
  FULLPEL_MV_STATS *in_stack_fffffffffffffe78;
  FULLPEL_MV *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe98;
  FULLPEL_MV in_stack_fffffffffffffea0;
  FULLPEL_MV *in_stack_fffffffffffffeb0;
  MV local_114;
  int local_110;
  undefined4 local_10c;
  undefined4 local_108;
  int local_104;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  YV12_BUFFER_CONFIG *local_e0;
  undefined8 local_d8 [13];
  undefined8 local_70;
  undefined4 *local_68;
  int_mv local_60;
  int local_5c;
  long local_58;
  undefined4 *local_50;
  int local_44;
  AV1_COMMON *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  MV *local_28;
  long local_18;
  long local_10;
  
  search_method_00 = '\0';
  local_40 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_44 = av1_num_planes(local_40);
  local_50 = (undefined4 *)(local_18 + 0x1a0);
  local_58 = **(long **)(local_18 + 0x2058);
  local_5c = (int)*(char *)(local_58 + 0x10 + (long)in_stack_00000018);
  local_60 = av1_get_ref_mv((MACROBLOCK *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                            in_stack_fffffffffffffd24);
  local_68 = local_50 + 4;
  local_70 = *(undefined8 *)(local_18 + 0xb9c8);
  local_e0 = av1_get_scaled_ref_frame
                       ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                        (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
  if (in_stack_00000018 != 0) {
    local_100 = *(undefined8 *)(local_68 + 0xc);
    local_f8 = *(undefined8 *)(local_68 + 0xe);
    local_f0 = *(undefined8 *)(local_68 + 0x10);
    local_e8 = *(undefined8 *)(local_68 + 0x12);
    puVar3 = (undefined8 *)(local_68 + (long)in_stack_00000018 * 8 + 0xc);
    *(undefined8 *)(local_68 + 0xc) = *puVar3;
    *(undefined8 *)(local_68 + 0xe) = puVar3[1];
    *(undefined8 *)(local_68 + 0x10) = puVar3[2];
    *(undefined8 *)(local_68 + 0x12) = puVar3[3];
  }
  if (local_e0 != (YV12_BUFFER_CONFIG *)0x0) {
    for (local_104 = 0; local_104 < local_44; local_104 = local_104 + 1) {
      lVar4 = (long)local_104;
      puVar3 = (undefined8 *)
               (local_50 + (long)local_104 * 0x28c + (long)in_stack_00000018 * 8 + 0x10);
      local_d8[lVar4 * 4] = *puVar3;
      local_d8[lVar4 * 4 + 1] = puVar3[1];
      local_d8[lVar4 * 4 + 2] = puVar3[2];
      local_d8[lVar4 * 4 + 3] = puVar3[3];
    }
    local_108 = *local_50;
    local_10c = local_50[1];
    av1_setup_pre_planes
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58,
               (scale_factors *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd90);
  }
  local_110 = 0x7fffffff;
  local_205 = av1_get_default_mv_search_method
                        (in_stack_fffffffffffffd30,
                         (MV_SPEED_FEATURES *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (BLOCK_SIZE)((uint)in_stack_fffffffffffffd24 >> 0x18));
  local_210 = av1_get_search_site_config
                        (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,search_method_00);
  uVar7 = (uint)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  local_214 = get_fullmv_from_mv(local_28);
  mv = (int_mv *)CONCAT44(uVar6,(uint)local_205);
  ref_mv_00 = (MV *)((ulong)uVar7 << 0x20);
  av1_make_default_fullpel_ms_params
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd97,in_stack_fffffffffffffd88,in_stack_fffffffffffffdb4,
             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0);
  av1_set_ms_compound_refs(&MStack_1e8,local_30,local_38,in_stack_00000008,in_stack_00000018);
  mvcost = (int **)0x0;
  local_110 = av1_full_pixel_search
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                         in_stack_fffffffffffffeb0);
  if (local_e0 != (YV12_BUFFER_CONFIG *)0x0) {
    for (local_218 = 0; local_218 < local_44; local_218 = local_218 + 1) {
      lVar4 = (long)local_218;
      lVar5 = (long)local_218;
      *(undefined8 *)(local_50 + lVar4 * 0x28c + 0x10) = local_d8[lVar5 * 4];
      *(undefined8 *)(local_50 + lVar4 * 0x28c + 0x12) = local_d8[lVar5 * 4 + 1];
      *(undefined8 *)(local_50 + lVar4 * 0x28c + 0x14) = local_d8[lVar5 * 4 + 2];
      *(undefined8 *)(local_50 + lVar4 * 0x28c + 0x16) = local_d8[lVar5 * 4 + 3];
    }
  }
  if ((*(byte *)(local_10 + 0x3c16e) & 1) != 0) {
    convert_fullmv_to_mv(mv);
  }
  local_220._4_4_ = 0;
  if (local_110 < 0x7fffffff) {
    local_220._4_4_ = (uint)((*(byte *)(local_10 + 0x3c16e) & 1) == 0) << 0x18;
  }
  local_220._4_4_ = local_220._4_4_ >> 0x18;
  if (local_220._4_4_ != 0) {
    av1_make_default_subpel_ms_params
              ((SUBPEL_MOTION_SEARCH_PARAMS *)in_stack_fffffffffffffd60,
               (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f,
               (MV *)CONCAT71(in_stack_fffffffffffffd41,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    av1_set_ms_compound_refs
              ((MSBuffers *)&stack0xfffffffffffffd98,local_30,local_38,in_stack_00000008,
               in_stack_00000018);
    MVar1 = get_mv_from_fullmv((FULLPEL_MV *)&local_114);
    mvcost = (int **)&local_220;
    mv = &local_224;
    ref_mv_00 = (MV *)0x0;
    local_110 = (**(code **)(local_10 + 0x60e00))
                          (local_50,local_40,&stack0xfffffffffffffd30,MVar1,local_204,&local_114);
  }
  if (in_stack_00000018 != 0) {
    *(undefined8 *)(local_68 + 0xc) = local_100;
    *(undefined8 *)(local_68 + 0xe) = local_f8;
    *(undefined8 *)(local_68 + 0x10) = local_f0;
    *(undefined8 *)(local_68 + 0x12) = local_e8;
  }
  if (local_110 < 0x7fffffff) {
    *local_28 = local_114;
  }
  *in_stack_00000010 = 0;
  iVar2 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          ref_mv_00,(int *)&mv->as_int,mvcost,0);
  *in_stack_00000010 = iVar2 + *in_stack_00000010;
  return local_110;
}

Assistant:

int av1_compound_single_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                                      BLOCK_SIZE bsize, MV *this_mv,
                                      const uint8_t *second_pred,
                                      const uint8_t *mask, int mask_stride,
                                      int *rate_mv, int ref_idx) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int ref = mbmi->ref_frame[ref_idx];
  const int_mv ref_mv = av1_get_ref_mv(x, ref_idx);
  struct macroblockd_plane *const pd = &xd->plane[0];
  const MvCosts *mv_costs = x->mv_costs;

  struct buf_2d backup_yv12[MAX_MB_PLANE];
  const YV12_BUFFER_CONFIG *const scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);

  // Check that this is either an interinter or an interintra block
  assert(has_second_ref(mbmi) || (ref_idx == 0 && is_interintra_mode(mbmi)));

  // Store the first prediction buffer.
  struct buf_2d orig_yv12;
  if (ref_idx) {
    orig_yv12 = pd->pre[0];
    pd->pre[0] = pd->pre[ref_idx];
  }

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    // The index below needs to be 0 instead of ref_idx since we assume the
    // 0th slot to be used for subsequent searches. Note that the ref_idx
    // reference buffer has been copied to the 0th slot in the code above.
    // Now we need to swap the reference frame for the 0th slot.
    av1_setup_pre_planes(xd, 0, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  int bestsme = INT_MAX;
  int_mv best_mv;

  // Make motion search params
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  FULLPEL_MV_STATS best_mv_stats;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, &cpi->sf.mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  // Use the mv result from the single mode as mv predictor.
  const FULLPEL_MV start_fullmv = get_fullmv_from_mv(this_mv);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                     &ref_mv.as_mv, start_fullmv,
                                     src_search_sites, search_method,
                                     /*fine_search_interval=*/0);

  av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                           mask_stride, ref_idx);

  // Small-range full-pixel motion search.
  bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search for the 0th slot.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = backup_yv12[i];
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(&best_mv);
  }
  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  if (use_fractional_mv) {
    int dis; /* TODO: use dis in distortion calculation later. */
    unsigned int sse;
    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv.as_mv,
                                      NULL);
    av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                             mask, mask_stride, ref_idx);
    ms_params.forced_stop = EIGHTH_PEL;
    MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
    bestsme = cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, start_mv, &best_mv_stats, &best_mv.as_mv, &dis,
        &sse, NULL);
  }

  // Restore the pointer to the first unscaled prediction buffer.
  if (ref_idx) pd->pre[0] = orig_yv12;

  if (bestsme < INT_MAX) *this_mv = best_mv.as_mv;

  *rate_mv = 0;

  *rate_mv += av1_mv_bit_cost(this_mv, &ref_mv.as_mv, mv_costs->nmv_joint_cost,
                              mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  return bestsme;
}